

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedColorMasks.cpp
# Opt level: O1

IterateResult __thiscall
glcts::DrawBuffersIndexedColorMasks::iterate(DrawBuffersIndexedColorMasks *this)

{
  RenderContext *pRVar1;
  TestLog *pTVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  undefined4 extraout_var;
  ulong uVar7;
  ConstPixelBufferAccess *pCVar8;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  uint uVar9;
  IterateResult IVar10;
  uint uVar11;
  qpTestResult testResult;
  DrawBuffersIndexedColorMasks *pDVar12;
  uint uVar13;
  GLint maxDrawBuffers;
  GLboolean mask [4];
  GLuint tex;
  TextureLevel textureLevel;
  BlendMaskStateMachine state;
  UVec4 c0;
  int local_2bc;
  GLboolean local_2b8 [4];
  uint local_2b4 [5];
  ulong local_2a0;
  RGBA local_298;
  uint local_294;
  string local_290;
  string local_270;
  ulong local_250;
  GLenum local_248;
  undefined4 local_244;
  void *local_240;
  DrawBuffersIndexedColorMasks *local_238;
  long local_230;
  TextureLevel local_228;
  undefined1 local_200 [40];
  undefined1 local_1d8 [8];
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [4];
  ios_base local_160 [264];
  ConstPixelBufferAccess local_58;
  long lVar6;
  
  iVar5 = (*((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar5);
  uVar9 = iterate::WriteMasksFormats[iterate::formatId];
  prepareFramebuffer(this);
  local_2bc = 0;
  (**(code **)(lVar6 + 0x868))(0x8824,&local_2bc);
  if (local_2bc < 4) {
    tcu::TestContext::setTestResult
              ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.super_TestNode
               .m_testCtx,QP_TEST_RESULT_FAIL,"Minimum number of draw buffers too low");
    return STOP;
  }
  (**(code **)(lVar6 + 0x6f8))(1,&local_244);
  (**(code **)(lVar6 + 0xb8))(0x8c1a,local_244);
  pDVar12 = (DrawBuffersIndexedColorMasks *)0x8c1a;
  local_250 = (ulong)uVar9;
  (**(code **)(lVar6 + 0x1398))(0x8c1a,1,(ulong)uVar9,0x20,0x20,local_2bc);
  if (0 < local_2bc) {
    iVar5 = 0;
    do {
      pDVar12 = (DrawBuffersIndexedColorMasks *)0x8d40;
      (**(code **)(lVar6 + 0x6b8))(0x8d40,iVar5 + 0x8ce0,local_244,0,iVar5);
      iVar5 = iVar5 + 1;
    } while (iVar5 < local_2bc);
  }
  local_248 = ReadableType(pDVar12,(GLenum)local_250);
  if (local_248 == 0x1401) {
    local_1d8 = (undefined1  [8])0x3e99999a3e19999a;
    uStack_1d0 = 0x3ee66666;
    uStack_1cc = 0x3f19999a;
    if (0 < local_2bc) {
      iVar5 = 0;
      do {
        (**(code **)(lVar6 + 0x1a8))(0x1800,iVar5,local_1d8);
        iVar5 = iVar5 + 1;
      } while (iVar5 < local_2bc);
    }
  }
  else if (local_248 == 0x1404) {
    local_1d8 = (undefined1  [8])0x300000002;
    uStack_1d0 = 4;
    uStack_1cc = 5;
    if (0 < local_2bc) {
      iVar5 = 0;
      do {
        (**(code **)(lVar6 + 0x1b0))(0x1800,iVar5,local_1d8);
        iVar5 = iVar5 + 1;
      } while (iVar5 < local_2bc);
    }
  }
  else if (local_248 == 0x1405) {
    local_1d8 = (undefined1  [8])0x300000002;
    uStack_1d0 = 4;
    uStack_1cc = 5;
    if (0 < local_2bc) {
      iVar5 = 0;
      do {
        (**(code **)(lVar6 + 0x1b8))(0x1800,iVar5,local_1d8);
        iVar5 = iVar5 + 1;
      } while (iVar5 < local_2bc);
    }
  }
  pDVar12 = (DrawBuffersIndexedColorMasks *)local_200;
  DrawBuffersIndexedBase::BlendMaskStateMachine::BlendMaskStateMachine
            ((BlendMaskStateMachine *)pDVar12,
             (this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context,
             ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.super_TestNode.
             m_testCtx)->m_log,local_2bc);
  local_2b8[0] = '\0';
  local_2b8[1] = '\0';
  local_2b8[2] = '\0';
  local_2b8[3] = '\0';
  if (0 < local_2bc) {
    uVar9 = 0;
    do {
      local_2b8[uVar9 & 3] = '\x01';
      pDVar12 = (DrawBuffersIndexedColorMasks *)local_200;
      DrawBuffersIndexedBase::BlendMaskStateMachine::SetColorMaski
                ((BlendMaskStateMachine *)local_200,uVar9,local_2b8[0],local_2b8[1],local_2b8[2],
                 local_2b8[3]);
      local_2b8[uVar9 & 3] = '\0';
      uVar9 = uVar9 + 1;
    } while ((int)uVar9 < local_2bc);
  }
  if (local_248 == 0x1401) {
    local_1d8 = (undefined1  [8])0x3f59999a3f59999a;
    uStack_1d0 = 0x3f59999a;
    uStack_1cc = 0x3f59999a;
    if (0 < local_2bc) {
      iVar5 = 0;
      do {
        pDVar12 = (DrawBuffersIndexedColorMasks *)0x1800;
        (**(code **)(lVar6 + 0x1a8))(0x1800,iVar5,local_1d8);
        iVar5 = iVar5 + 1;
      } while (iVar5 < local_2bc);
    }
  }
  else if (local_248 == 0x1404) {
    local_1d8 = (undefined1  [8])0x1700000017;
    uStack_1d0 = 0x17;
    uStack_1cc = 0x17;
    if (0 < local_2bc) {
      iVar5 = 0;
      do {
        pDVar12 = (DrawBuffersIndexedColorMasks *)0x1800;
        (**(code **)(lVar6 + 0x1b0))(0x1800,iVar5,local_1d8);
        iVar5 = iVar5 + 1;
      } while (iVar5 < local_2bc);
    }
  }
  else if (local_248 == 0x1405) {
    local_1d8 = (undefined1  [8])0x1700000017;
    uStack_1d0 = 0x17;
    uStack_1cc = 0x17;
    if (0 < local_2bc) {
      iVar5 = 0;
      do {
        pDVar12 = (DrawBuffersIndexedColorMasks *)0x1800;
        (**(code **)(lVar6 + 0x1b8))(0x1800,iVar5,local_1d8);
        iVar5 = iVar5 + 1;
      } while (iVar5 < local_2bc);
    }
  }
  local_230 = lVar6;
  local_294 = NumComponents(pDVar12,(GLenum)local_250);
  local_298 = GetEpsilon(this);
  bVar4 = 0;
  if (0 < local_2bc) {
    local_2b4[4] = (uint)CONCAT71((uint7)(uint3)(local_298.m_value >> 8),1);
    uVar7 = 0;
    local_238 = this;
    do {
      local_2a0 = uVar7;
      (**(code **)(local_230 + 0x1218))((int)uVar7 + 0x8ce0);
      uVar9 = (uint)local_2a0;
      if (local_248 == 0x1401) {
        local_2b4[0] = 0x26;
        local_2b4[1] = 0x4c;
        local_2b4[2] = 0x72;
        local_2b4[3] = 0x99;
        local_2b4[uVar9 & 3] = 0xd8;
        uVar9 = 0;
        if (1 < local_294) {
          uVar9 = local_2b4[1];
        }
        uVar11 = 0;
        if (2 < local_294) {
          uVar11 = local_2b4[2];
        }
        uVar13 = 0xff;
        if (local_294 == 4) {
          uVar13 = local_2b4[3];
        }
        local_2b4[1] = uVar9;
        local_2b4[3] = uVar13;
        local_2b4[2] = uVar11;
        uVar9 = uVar9 << 8 | local_2b4[0];
        local_240 = operator_new(0x1000);
        memset(local_240,0x2d,0x1000);
        local_1d8 = (undefined1  [8])0x300000008;
        tcu::TextureLevel::TextureLevel(&local_228,(TextureFormat *)local_1d8,0x20,0x20,1);
        pRVar1 = ((local_238->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context)->
                 m_renderCtx;
        tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1d8,&local_228);
        glu::readPixels(pRVar1,0,0,(PixelBufferAccess *)local_1d8);
        this = local_238;
        bVar3 = VerifyImg(local_238,&local_228,(RGBA)(uVar9 | uVar11 << 0x10 | uVar13 << 0x18),
                          local_298);
        if (!bVar3) {
          local_1d8 = (undefined1  [8])
                      ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&uStack_1d0,"Write mask error in texture format ",0x23);
          std::ostream::_M_insert<unsigned_long>((ulong)&uStack_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&uStack_1d0," occurred for buffer #",0x16);
          std::ostream::operator<<((ostringstream *)&uStack_1d0,(int)local_2a0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1d0,"\n",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1d0);
          std::ios_base::~ios_base(local_160);
          pTVar2 = ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                    super_TestNode.m_testCtx)->m_log;
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Result","");
          local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_290,"Rendered result image","");
          pCVar8 = &local_58;
          tcu::TextureLevel::getAccess((PixelBufferAccess *)pCVar8,&local_228);
          tcu::LogImage::LogImage
                    ((LogImage *)local_1d8,&local_270,&local_290,pCVar8,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)local_1d8,(int)pTVar2,__buf_01,(size_t)pCVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8[1]._0_8_ != local_1a8) {
            operator_delete((void *)local_1c8[1]._0_8_,local_1a8[0]._M_allocated_capacity + 1);
          }
          if (local_1d8 != (undefined1  [8])local_1c8) {
            operator_delete((void *)local_1d8,local_1c8[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p != &local_290.field_2) {
            operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
          }
          local_2b4[4] = 0;
        }
        tcu::TextureLevel::~TextureLevel(&local_228);
        operator_delete(local_240,0x1000);
      }
      else {
        if (local_248 == 0x1404) {
          local_2b4[0] = 2;
          local_2b4[1] = 3;
          local_2b4[2] = 4;
          local_2b4[3] = 5;
          local_2b4[uVar9 & 3] = 0x17;
          uVar9 = 0;
          if (1 < local_294) {
            uVar9 = local_2b4[1];
          }
          uVar11 = 0;
          if (2 < local_294) {
            uVar11 = local_2b4[2];
          }
          uVar13 = 1;
          if (local_294 == 4) {
            uVar13 = local_2b4[3];
          }
          local_2b4[1] = uVar9;
          local_2b4[3] = uVar13;
          local_2b4[2] = uVar11;
          uVar9 = uVar9 << 8 | local_2b4[0];
          local_1d8 = (undefined1  [8])0x1d00000008;
          tcu::TextureLevel::TextureLevel(&local_228,(TextureFormat *)local_1d8,0x20,0x20,1);
          pRVar1 = ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context)->m_renderCtx;
          tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1d8,&local_228);
          glu::readPixels(pRVar1,0,0,(PixelBufferAccess *)local_1d8);
          bVar3 = VerifyImg(this,&local_228,(RGBA)(uVar9 | uVar11 << 0x10 | uVar13 << 0x18),
                            local_298);
          if (!bVar3) {
            local_1d8 = (undefined1  [8])
                        ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                         super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&uStack_1d0,"Write mask error in texture format ",0x23);
            std::ostream::_M_insert<unsigned_long>((ulong)&uStack_1d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&uStack_1d0," occurred for buffer #",0x16);
            std::ostream::operator<<((ostringstream *)&uStack_1d0,(int)local_2a0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1d0,"\n",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1d0);
            std::ios_base::~ios_base(local_160);
            pTVar2 = ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log;
            local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Result","");
            local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_290,"Rendered result image","");
            pCVar8 = &local_58;
            tcu::TextureLevel::getAccess((PixelBufferAccess *)pCVar8,&local_228);
            tcu::LogImage::LogImage
                      ((LogImage *)local_1d8,&local_270,&local_290,pCVar8,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write((LogImage *)local_1d8,(int)pTVar2,__buf_00,(size_t)pCVar8);
LAB_00ced7cd:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8[1]._0_8_ != local_1a8) {
              operator_delete((void *)local_1c8[1]._0_8_,local_1a8[0]._M_allocated_capacity + 1);
            }
            if (local_1d8 != (undefined1  [8])local_1c8) {
              operator_delete((void *)local_1d8,local_1c8[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) {
              operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_dataplus._M_p != &local_270.field_2) {
              operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1
                             );
            }
            local_2b4[4] = 0;
          }
        }
        else {
          if (local_248 != 0x1405) goto LAB_00cedb5d;
          local_2b4[0] = 2;
          local_2b4[1] = 3;
          local_2b4[2] = 4;
          local_2b4[3] = 5;
          local_2b4[uVar9 & 3] = 0x17;
          uVar9 = 0;
          if (1 < local_294) {
            uVar9 = local_2b4[1];
          }
          uVar11 = 0;
          if (2 < local_294) {
            uVar11 = local_2b4[2];
          }
          uVar13 = 1;
          if (local_294 == 4) {
            uVar13 = local_2b4[3];
          }
          local_2b4[1] = uVar9;
          local_2b4[3] = uVar13;
          local_2b4[2] = uVar11;
          uVar9 = uVar9 << 8 | local_2b4[0];
          local_1d8 = (undefined1  [8])0x2100000008;
          tcu::TextureLevel::TextureLevel(&local_228,(TextureFormat *)local_1d8,0x20,0x20,1);
          pRVar1 = ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context)->m_renderCtx;
          tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1d8,&local_228);
          glu::readPixels(pRVar1,0,0,(PixelBufferAccess *)local_1d8);
          bVar3 = VerifyImg(this,&local_228,(RGBA)(uVar9 | uVar11 << 0x10 | uVar13 << 0x18),
                            local_298);
          if (!bVar3) {
            local_1d8 = (undefined1  [8])
                        ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                         super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&uStack_1d0,"Write mask error in texture format ",0x23);
            std::ostream::_M_insert<unsigned_long>((ulong)&uStack_1d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&uStack_1d0," occurred for buffer #",0x16);
            std::ostream::operator<<((ostringstream *)&uStack_1d0,(int)local_2a0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1d0,"\n",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1d0);
            std::ios_base::~ios_base(local_160);
            pTVar2 = ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log;
            local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Result","");
            local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_290,"Rendered result image","");
            pCVar8 = &local_58;
            tcu::TextureLevel::getAccess((PixelBufferAccess *)pCVar8,&local_228);
            tcu::LogImage::LogImage
                      ((LogImage *)local_1d8,&local_270,&local_290,pCVar8,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write((LogImage *)local_1d8,(int)pTVar2,__buf,(size_t)pCVar8);
            goto LAB_00ced7cd;
          }
        }
        tcu::TextureLevel::~TextureLevel(&local_228);
      }
LAB_00cedb5d:
      uVar9 = (int)local_2a0 + 1;
      uVar7 = (ulong)uVar9;
    } while ((int)uVar9 < local_2bc);
    bVar4 = (byte)local_2b4[4] ^ 1;
  }
  lVar6 = local_230;
  (**(code **)(local_230 + 0x238))(1,1,1,1);
  (**(code **)(lVar6 + 0xb8))(0x8c1a,0);
  (**(code **)(lVar6 + 0x480))(1,&local_244);
  releaseFramebuffer(this);
  iVar5 = (**(code **)(lVar6 + 0x800))();
  description = "Write mask error occurred";
  if (iVar5 != 0) {
    description = "Some functions generated error";
  }
  testResult = QP_TEST_RESULT_FAIL;
  if (iVar5 == 0 && (bVar4 & 1) == 0) {
    iterate::formatId = iterate::formatId + 1;
    IVar10 = CONTINUE;
    if (iterate::formatId < 0x19) goto LAB_00cedc20;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  tcu::TestContext::setTestResult
            ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.super_TestNode.
             m_testCtx,testResult,description);
  iterate::formatId = 0;
  IVar10 = STOP;
LAB_00cedc20:
  if ((_func_int **)local_200._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ - local_200._0_8_);
  }
  return IVar10;
}

Assistant:

tcu::TestNode::IterateResult DrawBuffersIndexedColorMasks::iterate()
{
	static const glw::GLenum WriteMasksFormats[] = { GL_R8,		 GL_RG8,	 GL_RGB8,	 GL_RGB565,  GL_RGBA4,
													 GL_RGB5_A1, GL_RGBA8,   GL_R8I,	  GL_R8UI,	GL_R16I,
													 GL_R16UI,   GL_R32I,	GL_R32UI,	GL_RG8I,	GL_RG8UI,
													 GL_RG16I,   GL_RG16UI,  GL_RG32I,	GL_RG32UI,  GL_RGBA8I,
													 GL_RGBA8UI, GL_RGBA16I, GL_RGBA16UI, GL_RGBA32I, GL_RGBA32UI };
	static const int	kSize	= 32;
	static unsigned int formatId = 0;

	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	glw::GLenum			  format = WriteMasksFormats[formatId];

	prepareFramebuffer();

	// Check number of available draw buffers
	glw::GLint maxDrawBuffers = 0;
	gl.getIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	if (maxDrawBuffers < 4)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Minimum number of draw buffers too low");
		return STOP;
	}

	// Prepare render targets
	glw::GLuint tex;
	gl.genTextures(1, &tex);
	gl.bindTexture(GL_TEXTURE_2D_ARRAY, tex);
	gl.texStorage3D(GL_TEXTURE_2D_ARRAY, 1, format, kSize, kSize, maxDrawBuffers);
	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		gl.framebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + i, tex, 0, i);
	}

	// Clear all buffers
	switch (ReadableType(format))
	{
	case GL_UNSIGNED_BYTE:
	{
		tcu::Vec4 c0(0.15f, 0.3f, 0.45f, 0.6f);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferfv(GL_COLOR, i, &c0[0]);
		}
		break;
	}
	case GL_UNSIGNED_INT:
	{
		tcu::UVec4 c0(2, 3, 4, 5);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferuiv(GL_COLOR, i, &c0[0]);
		}
		break;
	}
	case GL_INT:
	{
		tcu::IVec4 c0(2, 3, 4, 5);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferiv(GL_COLOR, i, &c0[0]);
		}
		break;
	}
	}

	// Set color masks for each buffer
	BlendMaskStateMachine state(m_context, m_testCtx.getLog(), maxDrawBuffers);

	glw::GLboolean mask[] = { GL_FALSE, GL_FALSE, GL_FALSE, GL_FALSE };
	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		mask[i % 4] = GL_TRUE;
		state.SetColorMaski(i, mask[0], mask[1], mask[2], mask[3]);
		mask[i % 4] = GL_FALSE;
	}

	// Clear all buffers
	switch (ReadableType(format))
	{
	case GL_UNSIGNED_BYTE:
	{
		tcu::Vec4 c1(0.85f, 0.85f, 0.85f, 0.85f);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferfv(GL_COLOR, i, &c1[0]);
		}
		break;
	}
	case GL_UNSIGNED_INT:
	{
		tcu::UVec4 c1(23, 23, 23, 23);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferuiv(GL_COLOR, i, &c1[0]);
		}
		break;
	}
	case GL_INT:
	{
		tcu::IVec4 c1(23, 23, 23, 23);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferiv(GL_COLOR, i, &c1[0]);
		}
		break;
	}
	}

	// Verify color
	int		  numComponents = NumComponents(format);
	tcu::RGBA epsilon		= GetEpsilon();
	bool	  success		= true;

	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		gl.readBuffer(GL_COLOR_ATTACHMENT0 + i);

		switch (ReadableType(format))
		{
		case GL_UNSIGNED_BYTE:
		{
			tcu::UVec4 e(static_cast<unsigned int>(0.15f * 255), static_cast<unsigned int>(0.30f * 255),
						 static_cast<unsigned int>(0.45f * 255), static_cast<unsigned int>(0.60f * 255));
			e[i % 4] = static_cast<unsigned int>(0.85f * 255);
			e		 = tcu::UVec4(e.x(), numComponents >= 2 ? e.y() : 0, numComponents >= 3 ? e.z() : 0,
						   numComponents == 4 ? e.w() : 255);
			tcu::RGBA expected(e.x(), e.y(), e.z(), e.w());

			std::vector<unsigned char> rendered(kSize * kSize * 4, 45);

			tcu::TextureLevel textureLevel(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8),
										   kSize, kSize);
			glu::readPixels(m_context.getRenderContext(), 0, 0, textureLevel.getAccess());

			if (!VerifyImg(textureLevel, expected, epsilon))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Write mask error in texture format " << format
								   << " occurred for buffer #" << i << "\n"
								   << tcu::TestLog::EndMessage;
				m_testCtx.getLog() << tcu::TestLog::Image("Result", "Rendered result image", textureLevel.getAccess());
				success = false;
			}
			break;
		}
		case GL_UNSIGNED_INT:
		{
			tcu::UVec4 e(2, 3, 4, 5);
			e[i % 4] = 23;
			e		 = tcu::UVec4(e.x(), numComponents >= 2 ? e.y() : 0, numComponents >= 3 ? e.z() : 0,
						   numComponents == 4 ? e.w() : 1);
			tcu::RGBA expected(e.x(), e.y(), e.z(), e.w());

			tcu::TextureLevel textureLevel(
				tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT32), kSize, kSize);
			glu::readPixels(m_context.getRenderContext(), 0, 0, textureLevel.getAccess());

			if (!VerifyImg(textureLevel, expected, epsilon))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Write mask error in texture format " << format
								   << " occurred for buffer #" << i << "\n"
								   << tcu::TestLog::EndMessage;
				m_testCtx.getLog() << tcu::TestLog::Image("Result", "Rendered result image", textureLevel.getAccess());
				success = false;
			}
			break;
		}
		case GL_INT:
		{
			tcu::UVec4 e(2, 3, 4, 5);
			e[i % 4] = 23;
			e		 = tcu::UVec4(e.x(), numComponents >= 2 ? e.y() : 0, numComponents >= 3 ? e.z() : 0,
						   numComponents == 4 ? e.w() : 1);
			tcu::RGBA expected(e.x(), e.y(), e.z(), e.w());

			tcu::TextureLevel textureLevel(
				tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::SIGNED_INT32), kSize, kSize);
			glu::readPixels(m_context.getRenderContext(), 0, 0, textureLevel.getAccess());

			if (!VerifyImg(textureLevel, expected, epsilon))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Write mask error in texture format " << format
								   << " occurred for buffer #" << i << "\n"
								   << tcu::TestLog::EndMessage;
				m_testCtx.getLog() << tcu::TestLog::Image("Result", "Rendered result image", textureLevel.getAccess());
				success = false;
			}
			break;
		}
		}
	}

	gl.colorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
	gl.bindTexture(GL_TEXTURE_2D_ARRAY, 0);
	gl.deleteTextures(1, &tex);
	releaseFramebuffer();

	// Check for error
	glw::GLenum error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Some functions generated error");
		formatId = 0;
		return STOP;
	}

	if (!success)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Write mask error occurred");
		formatId = 0;
		return STOP;
	}
	else
	{
		++formatId;
		if (formatId < (sizeof(WriteMasksFormats) / sizeof(WriteMasksFormats[0])))
		{
			return CONTINUE;
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
			formatId = 0;
			return STOP;
		}
	}
}